

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_styles.cpp
# Opt level: O2

void __thiscall
Am_Style_Data::Am_Style_Data
          (Am_Style_Data *this,float r,float g,float b,short thickness,Am_Line_Cap_Style_Flag cap,
          Am_Join_Style_Flag join,Am_Line_Solid_Flag line_flag,char *dash_l,int dash_l_length,
          Am_Fill_Solid_Flag fill_flag,Am_Fill_Poly_Flag poly,Am_Image_Array stipple)

{
  int iVar1;
  int iVar2;
  char *__dest;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002eb6d8;
  this->color_head = (Color_Index *)0x0;
  this->color_name = (char *)0x0;
  this->main_display = (Display *)0x0;
  this->color_allocated = true;
  this->red = r;
  this->green = g;
  this->blue = b;
  this->line_thickness = thickness;
  this->cap_style = cap;
  this->join_style = join;
  this->line_solid = line_flag;
  this->dash_list_length = dash_l_length;
  this->fill_solid = fill_flag;
  this->fill_poly = poly;
  Am_Image_Array::Am_Image_Array(&this->stipple_bitmap,(Am_Image_Array *)stipple.data);
  iVar1 = this->dash_list_length;
  iVar2 = -1;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  __dest = (char *)operator_new__((long)iVar2);
  this->dash_list = __dest;
  memcpy(__dest,dash_l,(long)iVar1);
  this->next = list;
  list = this;
  return;
}

Assistant:

Am_Style_Data::Am_Style_Data(float r, float g, float b, short thickness,
                             Am_Line_Cap_Style_Flag cap,
                             Am_Join_Style_Flag join,
                             Am_Line_Solid_Flag line_flag, const char *dash_l,
                             int dash_l_length, Am_Fill_Solid_Flag fill_flag,
                             Am_Fill_Poly_Flag poly, Am_Image_Array stipple)
    : color_name(nullptr), main_display(nullptr), color_head(nullptr), color_allocated(true),
      red(r), green(g), blue(b), line_thickness(thickness), cap_style(cap),
      join_style(join), line_solid(line_flag), dash_list_length(dash_l_length),
      fill_solid(fill_flag), fill_poly(poly), stipple_bitmap(stipple)
{
  dash_list = new char[dash_list_length];
  memcpy(dash_list, dash_l, dash_list_length);

  next = list;
  list = this;
}